

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 (*pauVar16) [32];
  int iVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  uint32_t out_counters [16];
  __m256i masks [16];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [9] [64];
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar41 = ZEXT1664((undefined1  [16])0x0);
  pauVar16 = &local_260;
  lVar19 = 0;
  local_500 = vmovdqa64_avx512f(auVar41);
  local_540 = vmovdqa64_avx512f(auVar41);
  local_580 = vmovdqa64_avx512f(auVar41);
  local_5c0 = vmovdqa64_avx512f(auVar41);
  local_600 = vmovdqa64_avx512f(auVar41);
  local_640 = vmovdqa64_avx512f(auVar41);
  local_680 = vmovdqa64_avx512f(auVar41);
  local_6c0 = vmovdqa64_avx512f(auVar41);
  do {
    lVar19 = lVar19 + 1;
    auVar21 = vpbroadcastw_avx512vl();
    *pauVar16 = auVar21;
    pauVar16 = pauVar16 + 1;
  } while (lVar19 != 0x10);
  uVar18 = 0;
  local_4c0[0] = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  if (0xfffff < len) {
    iVar17 = 0;
    uVar20 = 0;
    auVar14._8_8_ = uStack_218;
    auVar14._0_8_ = local_220;
    auVar14._16_8_ = uStack_210;
    auVar14._24_8_ = uStack_208;
    auVar13._8_8_ = uStack_1f8;
    auVar13._0_8_ = local_200;
    auVar13._16_8_ = uStack_1f0;
    auVar13._24_8_ = uStack_1e8;
    auVar12._8_8_ = uStack_1d8;
    auVar12._0_8_ = local_1e0;
    auVar12._16_8_ = uStack_1d0;
    auVar12._24_8_ = uStack_1c8;
    auVar11._8_8_ = uStack_1b8;
    auVar11._0_8_ = local_1c0;
    auVar11._16_8_ = uStack_1b0;
    auVar11._24_8_ = uStack_1a8;
    auVar10._8_8_ = uStack_198;
    auVar10._0_8_ = local_1a0;
    auVar10._16_8_ = uStack_190;
    auVar10._24_8_ = uStack_188;
    auVar9._8_8_ = uStack_178;
    auVar9._0_8_ = local_180;
    auVar9._16_8_ = uStack_170;
    auVar9._24_8_ = uStack_168;
    auVar8._8_8_ = uStack_158;
    auVar8._0_8_ = local_160;
    auVar8._16_8_ = uStack_150;
    auVar8._24_8_ = uStack_148;
    auVar7._8_8_ = uStack_138;
    auVar7._0_8_ = local_140;
    auVar7._16_8_ = uStack_130;
    auVar7._24_8_ = uStack_128;
    auVar6._8_8_ = uStack_118;
    auVar6._0_8_ = local_120;
    auVar6._16_8_ = uStack_110;
    auVar6._24_8_ = uStack_108;
    auVar5._8_8_ = uStack_f8;
    auVar5._0_8_ = local_100;
    auVar5._16_8_ = uStack_f0;
    auVar5._24_8_ = uStack_e8;
    auVar4._8_8_ = uStack_d8;
    auVar4._0_8_ = local_e0;
    auVar4._16_8_ = uStack_d0;
    auVar4._24_8_ = uStack_c8;
    auVar3._8_8_ = uStack_98;
    auVar3._0_8_ = local_a0;
    auVar3._16_8_ = uStack_90;
    auVar3._24_8_ = uStack_88;
    auVar21._8_8_ = uStack_78;
    auVar21._0_8_ = local_80;
    auVar21._16_8_ = uStack_70;
    auVar21._24_8_ = uStack_68;
    do {
      auVar22 = vmovdqa64_avx512vl(local_6c0._0_32_);
      auVar23 = vmovdqa64_avx512vl(local_6c0._32_32_);
      auVar24 = vmovdqa64_avx512vl(local_680._0_32_);
      auVar25 = vmovdqa64_avx512vl(local_680._32_32_);
      auVar26 = vmovdqa64_avx512vl(local_640._0_32_);
      auVar27 = vmovdqa64_avx512vl(local_640._32_32_);
      auVar28 = vmovdqa64_avx512vl(local_600._0_32_);
      auVar29 = vmovdqa64_avx512vl(local_600._32_32_);
      auVar30 = vmovdqa64_avx512vl(local_5c0._0_32_);
      auVar31 = vmovdqa64_avx512vl(local_5c0._32_32_);
      auVar32 = vmovdqa64_avx512vl(local_580._0_32_);
      auVar33 = vmovdqa64_avx512vl(local_580._32_32_);
      auVar34 = vmovdqa64_avx512vl(local_540._0_32_);
      auVar35 = vmovdqa64_avx512vl(local_540._32_32_);
      auVar36 = vmovdqa64_avx512vl(local_500._0_32_);
      auVar37 = vmovdqa64_avx512vl(local_500._32_32_);
      auVar1._8_8_ = uStack_b8;
      auVar1._0_8_ = local_c0;
      auVar1._16_8_ = uStack_b0;
      auVar1._24_8_ = uStack_a8;
      lVar19 = 0;
      do {
        auVar42 = *(undefined1 (*) [32])((long)data + lVar19);
        lVar19 = lVar19 + 0x20;
        auVar15._8_8_ = local_260._8_8_;
        auVar15._0_8_ = local_260._0_8_;
        auVar15._16_8_ = local_260._16_8_;
        auVar15._24_8_ = local_260._24_8_;
        auVar43 = vpand_avx2(auVar42,auVar15);
        auVar22 = vpaddw_avx512vl(auVar22,auVar43);
        auVar43._8_8_ = uStack_238;
        auVar43._0_8_ = local_240;
        auVar43._16_8_ = uStack_230;
        auVar43._24_8_ = uStack_228;
        auVar43 = vpand_avx2(auVar42,auVar43);
        auVar43 = vpsrlw_avx2(auVar43,1);
        auVar23 = vpaddw_avx512vl(auVar43,auVar23);
        auVar43 = vpand_avx2(auVar14,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,2);
        auVar24 = vpaddw_avx512vl(auVar43,auVar24);
        auVar43 = vpand_avx2(auVar13,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,3);
        auVar25 = vpaddw_avx512vl(auVar43,auVar25);
        auVar43 = vpand_avx2(auVar12,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,4);
        auVar26 = vpaddw_avx512vl(auVar43,auVar26);
        auVar43 = vpand_avx2(auVar11,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,5);
        auVar27 = vpaddw_avx512vl(auVar43,auVar27);
        auVar43 = vpand_avx2(auVar10,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,6);
        auVar28 = vpaddw_avx512vl(auVar43,auVar28);
        auVar43 = vpand_avx2(auVar9,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,7);
        auVar29 = vpaddw_avx512vl(auVar43,auVar29);
        auVar43 = vpand_avx2(auVar8,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,8);
        auVar30 = vpaddw_avx512vl(auVar43,auVar30);
        auVar43 = vpand_avx2(auVar7,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,9);
        auVar31 = vpaddw_avx512vl(auVar43,auVar31);
        auVar43 = vpand_avx2(auVar6,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,10);
        auVar32 = vpaddw_avx512vl(auVar43,auVar32);
        auVar43 = vpand_avx2(auVar5,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,0xb);
        auVar33 = vpaddw_avx512vl(auVar43,auVar33);
        auVar43 = vpand_avx2(auVar4,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,0xc);
        auVar34 = vpaddw_avx512vl(auVar43,auVar34);
        auVar43 = vpand_avx2(auVar1,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,0xd);
        auVar35 = vpaddw_avx512vl(auVar43,auVar35);
        auVar43 = vpand_avx2(auVar3,auVar42);
        auVar42 = vpand_avx2(auVar21,auVar42);
        auVar43 = vpsrlw_avx2(auVar43,0xe);
        auVar42 = vpsrlw_avx2(auVar42,0xf);
        auVar36 = vpaddw_avx512vl(auVar43,auVar36);
        auVar37 = vpaddw_avx512vl(auVar42,auVar37);
      } while ((int)lVar19 != 0x200000);
      local_6c0._0_32_ = vmovdqa64_avx512vl(auVar22);
      local_6c0._32_32_ = vmovdqa64_avx512vl(auVar23);
      local_680._0_32_ = vmovdqa64_avx512vl(auVar24);
      local_680._32_32_ = vmovdqa64_avx512vl(auVar25);
      local_640._0_32_ = vmovdqa64_avx512vl(auVar26);
      local_640._32_32_ = vmovdqa64_avx512vl(auVar27);
      local_600._0_32_ = vmovdqa64_avx512vl(auVar28);
      local_600._32_32_ = vmovdqa64_avx512vl(auVar29);
      local_5c0._0_32_ = vmovdqa64_avx512vl(auVar30);
      local_5c0._32_32_ = vmovdqa64_avx512vl(auVar31);
      local_580._0_32_ = vmovdqa64_avx512vl(auVar32);
      local_580._32_32_ = vmovdqa64_avx512vl(auVar33);
      local_540._0_32_ = vmovdqa64_avx512vl(auVar34);
      local_540._32_32_ = vmovdqa64_avx512vl(auVar35);
      local_500._0_32_ = vmovdqa64_avx512vl(auVar36);
      lVar19 = 0;
      local_500._32_32_ = vmovdqa64_avx512vl(auVar37);
      do {
        auVar1 = *(undefined1 (*) [32])(local_6c0 + lVar19 * 8);
        *(undefined1 (*) [32])(local_6c0 + lVar19 * 8) = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar37 = vpsrld_avx2(auVar1,0x10);
        auVar1 = vpblendw_avx2(auVar1,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
        auVar1 = vpaddd_avx2(auVar37,auVar1);
        auVar1 = vphaddd_avx2(auVar1,auVar1);
        auVar1 = vphaddd_avx2(auVar1,auVar1);
        auVar2 = vpaddd_avx(auVar1._16_16_,auVar1._0_16_);
        *(int *)(local_4c0[0] + lVar19) = *(int *)(local_4c0[0] + lVar19) + auVar2._0_4_;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x40);
      iVar17 = iVar17 + 0x10000;
      uVar20 = uVar20 + 1;
      data = data + 0x100000;
    } while (uVar20 != len >> 0x14);
    uVar18 = iVar17 * 0x10;
  }
  if (uVar18 < len) {
    auVar41 = vmovdqa64_avx512f(local_4c0[0]);
    auVar38 = vpmovsxbd_avx512f(_DAT_0011f080);
    auVar39 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar20 = (ulong)uVar18;
    do {
      uVar20 = uVar20 + 1;
      auVar40 = vpbroadcastd_avx512f();
      auVar40 = vpsrlvd_avx512f(auVar40,auVar38);
      auVar40 = vpandd_avx512f(auVar40,auVar39);
      auVar41 = vpaddd_avx512f(auVar40,auVar41);
    } while (len != uVar20);
    local_4c0[0] = vmovdqa64_avx512f(auVar41);
  }
  *(undefined8 *)flags = local_4c0[0]._0_8_;
  *(undefined8 *)(flags + 2) = local_4c0[0]._8_8_;
  *(undefined8 *)(flags + 4) = local_4c0[0]._16_8_;
  *(undefined8 *)(flags + 6) = local_4c0[0]._24_8_;
  *(undefined8 *)(flags + 8) = local_4c0[0]._32_8_;
  *(undefined8 *)(flags + 10) = local_4c0[0]._40_8_;
  *(undefined8 *)(flags + 0xc) = local_4c0[0]._48_8_;
  *(undefined8 *)(flags + 0xe) = local_4c0[0]._56_8_;
  return 0;
}

Assistant:

int pospopcnt_u16_avx2(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i counters[16];
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm256_set1_epi16(1 << i);
        counters[i] = _mm256_set1_epi16(0);
    }
    uint32_t out_counters[16] = {0};

    const __m256i hi_mask = _mm256_set1_epi32((int32_t)0xFFFF0000);
    const __m256i lo_mask = _mm256_set1_epi32(0x0000FFFF);
    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_update_cycles = n_cycles / 65536;

#define UPDATE(idx) counters[idx]  = _mm256_add_epi16(counters[idx],  _mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx))
#define ITERATION  {                               \
    UPDATE(0);  UPDATE(1);  UPDATE(2);  UPDATE(3); \
    UPDATE(4);  UPDATE(5);  UPDATE(6);  UPDATE(7); \
    UPDATE(8);  UPDATE(9);  UPDATE(10); UPDATE(11);\
    UPDATE(12); UPDATE(13); UPDATE(14); UPDATE(15);\
    ++pos;                                         \
}
    uint32_t pos = 0;
    for (size_t i = 0; i < n_update_cycles; ++i) { // each block of 2^16 values
        for (int k = 0; k < 65536; ++k) // max sum of each 16-bit value in a register
            ITERATION // unrolled

        // Compute vector sum
        for (int k = 0; k < 16; ++k) { // each flag register
            // Accumulator
            // ((16-bit high & 16 high) >> 16) + (16-bit low & 16-low)
            __m256i x = _mm256_add_epi32(
                           _mm256_srli_epi32(_mm256_and_si256(counters[k], hi_mask), 16),
                           _mm256_and_si256(counters[k], lo_mask));
            __m256i t1 = _mm256_hadd_epi32(x,x);
            __m256i t2 = _mm256_hadd_epi32(t1,t1);
            __m128i t4 = _mm_add_epi32(_mm256_castsi256_si128(t2),_mm256_extractf128_si256(t2,1));
            out_counters[k] += _mm_cvtsi128_si32(t4);

            /*
            // Naive counter
            uint16_t* d = (uint16_t*)(&counters[k]);
            for (int j = 0; j < 16; ++j) { // each uint16_t in the register
                out_counters[k] += d[j];
            }
            */

            counters[k] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef ITERATION
#undef UPDATE

    return 0;
}